

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O1

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceGaps
          (EdgeTracer *this,PointF dEdge,RegressionLine *line,int maxStepSize,
          RegressionLine *finishLine,double minDist)

{
  value_t_conflict *pvVar1;
  double *pdVar2;
  pointer *ppPVar3;
  pointer pPVar4;
  BitMatrix *pBVar5;
  ByteMatrix *pBVar6;
  pointer pcVar7;
  PointF p;
  int iVar8;
  bool bVar9;
  uint uVar10;
  Value VVar11;
  Value VVar12;
  double *pdVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  RegressionLine *pRVar20;
  int iVar21;
  uint uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  PointT<double> PVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  PointF PVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  PointT<double> PVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  PointT<double> p_00;
  PointT<double> p_01;
  uint local_f0;
  undefined1 local_e8 [20];
  int local_d4;
  int local_cc;
  double local_b0;
  double local_70;
  double local_68;
  double dStack_60;
  
  dVar39 = dEdge.y;
  dVar23 = dEdge.x;
  dVar24 = dVar23 * dVar23 + dVar39 * dVar39;
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar23;
  auVar26._8_8_ = dVar24;
  auVar26._0_8_ = dVar24;
  PVar33 = (PointF)divpd((undefined1  [16])dEdge,auVar26);
  line->_directionInward = PVar33;
  uVar10 = (uint)(ABS(dVar39) < ABS(dVar23));
  auVar34._0_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar34._4_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar34._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar34._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar39;
  auVar35 = ~auVar34 & auVar35 << 0x40 | auVar32 & auVar34;
  local_cc = 0;
  pvVar1 = &line->b;
  pdVar2 = &(line->_directionInward).y;
  local_70 = 0.0;
  local_b0 = 0.0;
  iVar8 = 0;
  local_f0 = maxStepSize;
  iVar21 = maxStepSize;
  do {
    dVar23 = (this->super_BitMatrixCursorF).p.x;
    dVar24 = (this->super_BitMatrixCursorF).p.y;
    if ((dVar23 == local_b0) && (!NAN(dVar23) && !NAN(local_b0))) {
      if ((dVar24 != local_70) || (NAN(dVar24) || NAN(local_70))) goto LAB_00154545;
LAB_00154e03:
      local_f0._0_1_ = 0;
      break;
    }
LAB_00154545:
    iVar18 = iVar8 + 1;
    iVar14 = iVar18;
    if (iVar8 == 0) {
      iVar14 = 2;
    }
    if (iVar14 * maxStepSize < local_cc) goto LAB_00154e03;
    if ((!NAN(line->a)) &&
       ((line->a * dVar23 + (this->super_BitMatrixCursorF).p.y * line->b) - line->c < -5.0)) {
      bVar9 = RegressionLine::evaluate<double>
                        (line,(line->_points).
                              super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                         (line->_points).
                         super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (bVar9) {
        dVar39 = line->a;
        pdVar13 = pdVar2;
        if (!NAN(dVar39)) {
          pdVar13 = pvVar1;
        }
        if (-5.0 <= ((double)(~-(ulong)(!NAN(dVar39) && !NAN(dVar39)) &
                              (ulong)(line->_directionInward).x |
                             (ulong)dVar39 & -(ulong)(!NAN(dVar39) && !NAN(dVar39))) *
                     (this->super_BitMatrixCursorF).p.x +
                    (this->super_BitMatrixCursorF).p.y * *pdVar13) - line->c) goto LAB_00154626;
      }
      goto LAB_00154e03;
    }
LAB_00154626:
    if ((NAN(line->a)) ||
       ((line->a * (this->super_BitMatrixCursorF).p.x + (this->super_BitMatrixCursorF).p.y * line->b
        ) - line->c <= 3.0)) {
      pPVar4 = (line->_points).
               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((line->_points).
          super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>._M_impl
          .super__Vector_impl_data._M_start == pPVar4) {
        dVar40 = 0.0;
        dVar39 = 0.0;
        PVar33.x = (this->super_BitMatrixCursorF).p.x;
        PVar33.y = (this->super_BitMatrixCursorF).p.y;
        RegressionLine::add(line,PVar33);
LAB_0015494b:
        dVar25 = ABS(dVar39);
        if (ABS(dVar39) <= ABS(dVar40)) {
          dVar25 = ABS(dVar40);
        }
        if (2.0 <= dVar25) goto LAB_001549a7;
        bVar9 = true;
        iVar18 = iVar8;
        if (iVar8 == 0) {
          bVar9 = (int)((ulong)((long)(line->_points).
                                      super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(line->_points).
                                     super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) < iVar21 * 2;
          local_f0 = (uint)((byte)local_f0 & bVar9);
          iVar18 = 0;
        }
      }
      else {
        dVar40 = (this->super_BitMatrixCursorF).p.x - pPVar4[-1].x;
        dVar39 = (this->super_BitMatrixCursorF).p.y - pPVar4[-1].y;
        PVar37 = (this->super_BitMatrixCursorF).d;
        dVar25 = PVar37.x;
        dVar31 = SUB168((undefined1  [16])PVar37 & _DAT_001942a0,8);
        dVar30 = SUB168((undefined1  [16])PVar37 & _DAT_001942a0,0);
        if (dVar30 <= dVar31) {
          dVar25 = 0.0;
        }
        p.x = (this->super_BitMatrixCursorF).p.x;
        p.y = (this->super_BitMatrixCursorF).p.y;
        RegressionLine::add(line,p);
        if (dVar25 * dVar40 + dVar39 * (double)(~-(ulong)(dVar31 < dVar30) & (ulong)PVar37.y) <= 1.0
           ) goto LAB_0015494b;
LAB_001549a7:
        if ((0 < iVar8) ||
           (bVar9 = true,
           0x50 < (ulong)((long)(line->_points).
                                super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(line->_points).
                               super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start))) {
          bVar9 = updateDirectionFromLine(this,line);
          if (bVar9) {
            bVar9 = true;
            if (2 < iVar8 && minDist != 0.0) {
              pPVar4 = (line->_points).
                       super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              dVar39 = (this->super_BitMatrixCursorF).p.x - pPVar4->x;
              dVar40 = (this->super_BitMatrixCursorF).p.y - pPVar4->y;
              dVar39 = dVar39 * dVar39 + dVar40 * dVar40;
              if (dVar39 < 0.0) {
                dVar39 = sqrt(dVar39);
              }
              else {
                dVar39 = SQRT(dVar39);
              }
              if (minDist < dVar39) {
                ppPVar3 = &(line->_points).
                           super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppPVar3 = *ppPVar3 + -1;
                local_f0 = 1;
                bVar9 = false;
                iVar18 = iVar8;
              }
            }
          }
          else {
            bVar9 = false;
            local_f0 = 0;
          }
        }
      }
      iVar8 = iVar18;
      if (!bVar9) break;
    }
    else {
      dVar39 = (this->super_BitMatrixCursorF).d.x;
      dVar40 = (this->super_BitMatrixCursorF).d.y;
      dVar25 = dVar39 * dVar39 + dVar40 * dVar40;
      if (dVar25 < 0.0) {
        dVar25 = sqrt(dVar25);
      }
      else {
        dVar25 = SQRT(dVar25);
      }
      dVar31 = line->a;
      pdVar13 = pdVar2;
      if (!NAN(dVar31)) {
        pdVar13 = pvVar1;
      }
      if ((0.7 < ABS((double)(~-(ulong)(!NAN(dVar31) && !NAN(dVar31)) &
                              (ulong)(line->_directionInward).x |
                             (ulong)dVar31 & -(ulong)(!NAN(dVar31) && !NAN(dVar31))) *
                     (dVar39 / dVar25) + (dVar40 / dVar25) * *pdVar13)) ||
         (bVar9 = RegressionLine::evaluate(line,1.5,false), !bVar9)) goto LAB_00154e03;
      dVar39 = (this->super_BitMatrixCursorF).p.x;
      dVar40 = (this->super_BitMatrixCursorF).p.y;
      dVar25 = line->a;
      uVar10 = (uint)(!NAN(dVar25) && !NAN(dVar25));
      auVar28._0_8_ = CONCAT44((int)(uVar10 << 0x1f) >> 0x1f,(int)(uVar10 << 0x1f) >> 0x1f);
      auVar28._8_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      auVar28._12_4_ = (int)(uVar10 << 0x1f) >> 0x1f;
      dVar25 = (double)(~auVar28._0_8_ & (ulong)(line->_directionInward).x |
                       (ulong)dVar25 & auVar28._0_8_);
      dVar31 = (double)(~auVar28._8_8_ & (ulong)(line->_directionInward).y |
                       (ulong)line->b & auVar28._8_8_);
      dVar30 = (dVar25 * dVar39 + dVar40 * dVar31) - line->c;
      dVar39 = dVar39 - dVar30 * dVar25;
      dVar40 = dVar40 - dVar30 * dVar31;
      while( true ) {
        pPVar4 = (line->_points).
                 super__Vector_base<ZXing::PointT<double>,_std::allocator<ZXing::PointT<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        dVar25 = pPVar4[-1].x;
        dVar31 = pPVar4[-1].y;
        dVar30 = line->a;
        pdVar13 = pdVar2;
        if (!NAN(dVar30)) {
          pdVar13 = pvVar1;
        }
        dVar30 = (double)(~-(ulong)(!NAN(dVar30) && !NAN(dVar30)) &
                          (ulong)(line->_directionInward).x |
                         (ulong)dVar30 & -(ulong)(!NAN(dVar30) && !NAN(dVar30)));
        dVar38 = (dVar30 * dVar25 + dVar31 * *pdVar13) - line->c;
        dVar25 = dVar39 - (dVar25 - dVar30 * dVar38);
        dVar31 = dVar40 - (dVar31 - dVar38 * *pdVar13);
        dVar25 = dVar25 * dVar25 + dVar31 * dVar31;
        if (dVar25 < 0.0) {
          dVar25 = sqrt(dVar25);
        }
        else {
          dVar25 = SQRT(dVar25);
        }
        if (1.0 <= dVar25) break;
        dVar39 = dVar39 + (this->super_BitMatrixCursorF).d.x;
        dVar40 = dVar40 + (this->super_BitMatrixCursorF).d.y;
      }
      dVar39 = floor(dVar39);
      dVar40 = floor(dVar40);
      (this->super_BitMatrixCursorF).p.x = dVar39 + 0.5;
      (this->super_BitMatrixCursorF).p.y = dVar40 + 0.5;
    }
    iVar18 = iVar21;
    if ((!NAN(finishLine->a)) &&
       (iVar18 = (int)((finishLine->a * (this->super_BitMatrixCursorF).p.x +
                       (this->super_BitMatrixCursorF).p.y * finishLine->b) - finishLine->c),
       iVar21 < iVar18)) {
      iVar18 = iVar21;
    }
    iVar21 = iVar18;
    local_cc = local_cc + 1;
    iVar18 = 3;
    if (3 < iVar21) {
      iVar18 = iVar21;
    }
    iVar14 = NAN(line->a) + 2 + (uint)NAN(line->a);
    if (iVar21 == 1) {
      iVar14 = 3;
    }
    local_d4 = 1;
    pRVar20 = line;
    do {
      bVar9 = iVar21 < 1;
      if (0 < iVar21) {
        uVar17 = 1;
        do {
          iVar16 = (int)uVar17;
          uVar10 = (uint)(uVar17 >> 1);
          uVar17 = 0;
          do {
            uVar22 = (uint)uVar17;
            if (uVar22 == ((uVar10 & 0x7ffffffe) + 2) * local_d4 + 1) break;
            uVar15 = -(int)(uVar17 >> 1);
            if ((uVar17 & 1) != 0) {
              uVar15 = uVar22 + 1 >> 1;
            }
            local_68 = auVar35._0_8_;
            dStack_60 = auVar35._8_8_;
            PVar37.x = (double)(int)uVar15 * local_68 +
                       (this->super_BitMatrixCursorF).d.x * (double)iVar16 +
                       (this->super_BitMatrixCursorF).p.x;
            PVar37.y = (double)(int)uVar15 * dStack_60 +
                       (this->super_BitMatrixCursorF).d.y * (double)iVar16 +
                       (this->super_BitMatrixCursorF).p.y;
            p_00.x = local_68 + PVar37.x;
            p_00.y = dStack_60 + PVar37.y;
            VVar11 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                               (&this->super_BitMatrixCursorF,p_00);
            iVar19 = iVar18;
            if (VVar11.v == 1) {
              do {
                pRVar20 = (RegressionLine *)0x2;
                local_e8._0_8_ = PVar37.x;
                if (((((double)local_e8._0_8_ < 0.0) ||
                     (pBVar5 = (this->super_BitMatrixCursorF).img,
                     (double)pBVar5->_width <= (double)local_e8._0_8_)) ||
                    (local_e8._8_8_ = PVar37.y, (double)local_e8._8_8_ < 0.0)) ||
                   ((double)pBVar5->_height <= (double)local_e8._8_8_)) break;
                VVar12 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                                   (&this->super_BitMatrixCursorF,PVar37);
                if (VVar12.v == 0) {
                  dVar39 = floor((double)local_e8._0_8_);
                  dVar40 = floor((double)local_e8._8_8_);
                  PVar27.x = dVar39 + 0.5;
                  PVar27.y = dVar40 + 0.5;
                  (this->super_BitMatrixCursorF).p = PVar27;
                  pBVar6 = this->history;
                  if (pBVar6 != (ByteMatrix *)0x0 && iVar21 == 1) {
                    iVar19 = (int)(this->super_BitMatrixCursorF).p.y *
                             (pBVar6->super_Matrix<signed_char>)._width + (int)PVar27.x;
                    pcVar7 = (pBVar6->super_Matrix<signed_char>)._data.
                             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    if (this->state == (int)pcVar7[iVar19]) break;
                    pcVar7[iVar19] = (char)this->state;
                  }
                  pRVar20 = (RegressionLine *)0x0;
                  break;
                }
                local_e8._0_8_ = (double)local_e8._0_8_ - local_68;
                local_e8._8_8_ = (double)local_e8._8_8_ - dStack_60;
                p_01.x = (double)local_e8._0_8_ - (this->super_BitMatrixCursorF).d.x;
                p_01.y = (double)local_e8._8_8_ - (this->super_BitMatrixCursorF).d.y;
                VVar12 = BitMatrixCursor<ZXing::PointT<double>_>::testAt<double>
                                   (&this->super_BitMatrixCursorF,p_01);
                uVar15 = (uint)(VVar12.v == 1);
                auVar29._0_8_ =
                     CONCAT44((int)(uVar15 << 0x1f) >> 0x1f,(int)(uVar15 << 0x1f) >> 0x1f);
                auVar29._8_4_ = (int)(uVar15 << 0x1f) >> 0x1f;
                auVar29._12_4_ = (int)(uVar15 << 0x1f) >> 0x1f;
                auVar36._0_8_ =
                     (ulong)((double)local_e8._0_8_ - (this->super_BitMatrixCursorF).d.x) &
                     auVar29._0_8_;
                auVar36._8_8_ =
                     (ulong)((double)local_e8._8_8_ - (this->super_BitMatrixCursorF).d.y) &
                     auVar29._8_8_;
                PVar37 = (PointT<double>)(auVar36 | ~auVar29 & local_e8._0_16_);
                iVar19 = iVar19 + -1;
              } while (iVar19 != 0);
            }
            uVar17 = (ulong)(uVar22 + 1);
          } while (VVar11.v != 1);
          if (uVar22 <= ((uVar10 & 0x3ffffffe) + 2) * local_d4) break;
          bVar9 = iVar21 <= iVar16;
          uVar17 = (ulong)(iVar16 + 1);
        } while (iVar16 != iVar21);
      }
      iVar16 = (int)pRVar20;
      if (!bVar9) goto LAB_00154d95;
      local_d4 = local_d4 + 1;
    } while (local_d4 != iVar14);
    iVar16 = 1;
LAB_00154d95:
    if (iVar16 != 0) {
      if ((iVar16 != 1) || (NAN(finishLine->a))) {
        local_f0 = 0;
      }
      else {
        local_f0 = (uint)((int)((finishLine->a * (this->super_BitMatrixCursorF).p.x +
                                (this->super_BitMatrixCursorF).p.y * finishLine->b) - finishLine->c)
                         <= iVar21 + 1);
      }
    }
    local_b0 = dVar23;
    local_70 = dVar24;
  } while (iVar16 == 0);
  return (bool)((byte)local_f0 & 1);
}

Assistant:

bool traceGaps(PointF dEdge, RegressionLine& line, int maxStepSize, const RegressionLine& finishLine = {}, double minDist = 0)
	{
		line.setDirectionInward(dEdge);
		int gaps = 0, steps = 0, maxStepsPerGap = maxStepSize;
		PointF lastP;
		do {
			// detect an endless loop (lack of progress). if encountered, please report.
			// this fixes a deadlock in falsepositives-1/#570.png and the regression in #574
			if (p == std::exchange(lastP, p) || steps++ > (gaps == 0 ? 2 : gaps + 1) * maxStepsPerGap)
				return false;
			log(p);

			// if we drifted too far outside of the code, break
			if (line.isValid() && line.signedDistance(p) < -5 && (!line.evaluate() || line.signedDistance(p) < -5))
				return false;

			// if we are drifting towards the inside of the code, pull the current position back out onto the line
			if (line.isValid() && line.signedDistance(p) > 3) {
				// The current direction d and the line we are tracing are supposed to be roughly parallel.
				// In case the 'go outward' step in traceStep lead us astray, we might end up with a line
				// that is almost perpendicular to d. Then the back-projection below can result in an
				// endless loop. Break if the angle between d and line is greater than 45 deg.
				if (std::abs(dot(normalized(d), line.normal())) > 0.7) // thresh is approx. sin(45 deg)
					return false;

				// re-evaluate line with all the points up to here before projecting
				if (!line.evaluate(1.5))
					return false;

				auto np = line.project(p);
				// make sure we are making progress even when back-projecting:
				// consider a 90deg corner, rotated 45deg. we step away perpendicular from the line and get
				// back projected where we left off the line.
				// The 'while' instead of 'if' was introduced to fix the issue with #245. It turns out that
				// np can actually be behind the projection of the last line point and we need 2 steps in d
				// to prevent a dead lock. see #245.png
				while (distance(np, line.project(line.points().back())) < 1)
					np = np + d;
				p = centered(np);
			}
			else {
				auto curStep = line.points().empty() ? PointF() : p - line.points().back();
				auto stepLengthInMainDir = line.points().empty() ? 0.0 : dot(mainDirection(d), curStep);
				line.add(p);

				if (stepLengthInMainDir > 1 || maxAbsComponent(curStep) >= 2) {
					++gaps;
					if (gaps >= 2 || line.points().size() > 5) {
						if (!updateDirectionFromLine(line))
							return false;
						// check if the first half of the top-line trace is complete.
						// the minimum code size is 10x10 -> every code has at least 4 gaps
						if (minDist && gaps >= 4 && distance(p, line.points().front()) > minDist) {
							// undo the last insert, it will be inserted again after the restart
							line.pop_back();
							--gaps;
							return true;
						}
					}
				} else if (gaps == 0 && Size(line.points()) >= 2 * maxStepSize) {
					return false; // no point in following a line that has no gaps
				}
			}

			if (finishLine.isValid())
				UpdateMin(maxStepSize, static_cast<int>(finishLine.signedDistance(p)));

			auto stepResult = traceStep(dEdge, maxStepSize, line.isValid());

			if (stepResult != StepResult::FOUND)
				// we are successful iff we found an open end across a valid finishLine
				return stepResult == StepResult::OPEN_END && finishLine.isValid() &&
					   static_cast<int>(finishLine.signedDistance(p)) <= maxStepSize + 1;
		} while (true);
	}